

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

iterator __thiscall
fmt::v10::formatter<ot::commissioner::coap::OptionType,_char,_void>::format
          (formatter<ot::commissioner::coap::OptionType,_char,_void> *this,OptionType optionType,
          format_context *ctx)

{
  int iVar1;
  arg_ref<char> ref;
  char *begin;
  appender aVar2;
  dynamic_format_specs<char> *value;
  undefined6 in_register_00000032;
  buffer<char> *this_00;
  format_specs<char> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar3;
  string_view fmt;
  basic_string_view<char> s;
  format_args args;
  char *pcStackY_a0;
  format_specs<char> local_78;
  dynamic_format_specs<char> specs;
  
  iVar1 = (int)CONCAT62(in_register_00000032,optionType);
  pcStackY_a0 = (char *)0x8;
  switch(iVar1) {
  case 1:
    pcVar3 = "kIfMatch";
    break;
  case 3:
    pcVar3 = "kUriHost";
    break;
  case 4:
    pcVar3 = "kETag";
    pcStackY_a0 = (char *)0x5;
    break;
  case 5:
    pcVar3 = "kIfNonMatch";
    pcStackY_a0 = (char *)0xb;
    break;
  case 6:
    pcVar3 = "kObserve";
    break;
  case 7:
    pcVar3 = "kUriPort";
    break;
  case 8:
    pcVar3 = "kLocationPath";
    pcStackY_a0 = (char *)0xd;
    break;
  case 0xb:
    pcVar3 = "kUriPath";
    break;
  case 0xc:
    pcVar3 = "kContentFormat";
    goto LAB_00145922;
  case 0xe:
    pcVar3 = "kMaxAge";
    goto LAB_00145936;
  case 0xf:
    pcVar3 = "kUriQuery";
    goto LAB_001458d4;
  case 0x11:
    pcVar3 = "kAccept";
LAB_00145936:
    pcStackY_a0 = (char *)0x7;
    break;
  case 0x14:
    pcVar3 = "kLocationQuery";
LAB_00145922:
    pcStackY_a0 = (char *)0xe;
    break;
  case 0x23:
    pcVar3 = "kProxyUri";
LAB_001458d4:
    pcStackY_a0 = (char *)0x9;
    break;
  default:
    if (iVar1 == 0x27) {
      pcVar3 = "kProxyScheme";
      pcStackY_a0 = (char *)0xc;
      break;
    }
    if (iVar1 == 0x3c) {
      pcVar3 = "kSize1";
      pcStackY_a0 = (char *)0x6;
      break;
    }
  case 2:
  case 9:
  case 10:
  case 0xd:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    specs.super_format_specs<char>.width = 1;
    specs.super_format_specs<char>._8_8_ = anon_var_dwarf_10cd1d;
    specs.width_ref.kind = 0xb;
    specs.width_ref._4_4_ = 0;
    specs.width_ref.val.name.data_ = (char *)0x100000000;
    specs.precision_ref._0_8_ =
         detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "unknown({})";
    specs.width_ref.val.name.size_ = (size_t)&specs;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (begin,"",(format_string_checker<char> *)&specs);
      }
    }
    local_78._0_8_ = ZEXT28(optionType);
    in_R8 = &local_78;
    fmt.size_ = 1;
    fmt.data_ = (char *)0xb;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)in_R8;
    vformat_abi_cxx11_((string *)&specs,(v10 *)"unknown({})",fmt,args);
    pcStackY_a0 = (char *)specs.super_format_specs<char>._8_8_;
    pcVar3 = (char *)specs.super_format_specs<char>._0_8_;
    std::__cxx11::string::~string((string *)&specs);
  }
  if ((this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref.
      kind == none &&
      (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.kind
      == none) {
    this_00 = (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    value = (dynamic_format_specs<char> *)this;
  }
  else {
    specs.super_format_specs<char>.width =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
         super_format_specs<char>.width;
    specs.super_format_specs<char>.precision =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
         super_format_specs<char>.precision;
    specs.super_format_specs<char>.type =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
         super_format_specs<char>.type;
    specs.super_format_specs<char>._9_2_ =
         *(undefined2 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
           super_format_specs<char>.field_0x9;
    specs.super_format_specs<char>.fill =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
         super_format_specs<char>.fill;
    specs.width_ref.kind =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.
         kind;
    specs.width_ref._4_4_ =
         *(undefined4 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.
           field_0x4;
    specs.width_ref.val.name.data_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.val
         .name.data_;
    specs.width_ref.val.name.size_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.val
         .name.size_;
    specs.precision_ref.kind =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref
         .kind;
    specs.precision_ref._4_4_ =
         *(undefined4 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
           precision_ref.field_0x4;
    specs.precision_ref.val.name.data_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref
         .val.name.data_;
    specs.precision_ref.val.name.size_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref
         .val.name.size_;
    value = &specs;
    detail::
    handle_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              ((int *)value,
               (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
               width_ref,ctx);
    ref.val.name.data_ = specs.precision_ref.val.name.data_;
    ref.kind = specs.precision_ref.kind;
    ref._4_4_ = specs.precision_ref._4_4_;
    ref.val.name.size_ = specs.precision_ref.val.name.size_;
    detail::
    handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              (&specs.super_format_specs<char>.precision,ref,ctx);
    this_00 = (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  s.size_ = (size_t)value;
  s.data_ = pcStackY_a0;
  aVar2 = detail::write<char,fmt::v10::appender>((detail *)this_00,(appender)pcVar3,s,in_R8);
  return (iterator)aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto fmt::formatter<ot::commissioner::coap::OptionType>::format(ot::commissioner::coap::OptionType optionType,
                                                                format_context &ctx) -> decltype(ctx.out())
{
    using ot::commissioner::coap::OptionType;
    string_view name;
    switch (optionType)
    {
    case OptionType::kIfMatch:
        name = "kIfMatch";
        break;
    case OptionType::kUriHost:
        name = "kUriHost";
        break;
    case OptionType::kETag:
        name = "kETag";
        break;
    case OptionType::kIfNonMatch:
        name = "kIfNonMatch";
        break;
    case OptionType::kObserve:
        name = "kObserve";
        break;
    case OptionType::kUriPort:
        name = "kUriPort";
        break;
    case OptionType::kLocationPath:
        name = "kLocationPath";
        break;
    case OptionType::kUriPath:
        name = "kUriPath";
        break;
    case OptionType::kContentFormat:
        name = "kContentFormat";
        break;
    case OptionType::kMaxAge:
        name = "kMaxAge";
        break;
    case OptionType::kUriQuery:
        name = "kUriQuery";
        break;
    case OptionType::kAccept:
        name = "kAccept";
        break;
    case OptionType::kLocationQuery:
        name = "kLocationQuery";
        break;
    case OptionType::kProxyUri:
        name = "kProxyUri";
        break;
    case OptionType::kProxyScheme:
        name = "kProxyScheme";
        break;
    case OptionType::kSize1:
        name = "kSize1";
        break;
    default:
        name = fmt::format(FMT_STRING("unknown({})"), static_cast<int>(optionType));
    }
    return formatter<string_view>::format(name, ctx);
}